

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::anon_unknown_69::WindowFlowController::WindowFlowController
          (WindowFlowController *this,WindowGetter *windowGetter)

{
  SourceLocation location;
  SourceLocation local_40;
  WindowGetter *local_18;
  WindowGetter *windowGetter_local;
  WindowFlowController *this_local;
  
  local_18 = windowGetter;
  windowGetter_local = (WindowGetter *)this;
  RpcFlowController::RpcFlowController(&this->super_RpcFlowController);
  kj::TaskSet::ErrorHandler::ErrorHandler(&this->super_ErrorHandler);
  (this->super_RpcFlowController)._vptr_RpcFlowController = (_func_int **)&PTR_send_00d8d7c8;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_00d8d7f0;
  this->windowGetter = local_18;
  this->inFlight = 0;
  this->maxMessageSize = 0;
  kj::OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception>::OneOf
            (&this->state);
  kj::Maybe<kj::Own<kj::PromiseFulfiller<kj::Promise<void>_>,_std::nullptr_t>_>::Maybe
            (&this->emptyFulfiller);
  kj::SourceLocation::SourceLocation
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
             ,"WindowFlowController",0x123b,0x25);
  location.function = local_40.function;
  location.fileName = local_40.fileName;
  location.lineNumber = local_40.lineNumber;
  location.columnNumber = local_40.columnNumber;
  kj::TaskSet::TaskSet(&this->tasks,&this->super_ErrorHandler,location);
  kj::OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>,kj::Exception>::
  init<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>>
            ((OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>,kj::Exception>
              *)&this->state);
  return;
}

Assistant:

WindowFlowController(RpcFlowController::WindowGetter& windowGetter)
      : windowGetter(windowGetter), tasks(*this) {
    state.init<Running>();
  }